

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O0

void __thiscall
embree::TutorialApplication::renderToFile(TutorialApplication *this,FileName *fileName)

{
  long *plVar1;
  long *in_RDI;
  size_t in_stack_00000078;
  size_t in_stack_00000080;
  Ref<embree::Image> image;
  uint i;
  ISPCCamera ispccamera;
  uint in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  TutorialApplication *in_stack_ffffffffffffff10;
  allocator local_91;
  string local_90 [31];
  undefined1 in_stack_ffffffffffffff8f;
  string *in_stack_ffffffffffffff90;
  uint local_68;
  undefined1 local_64 [3];
  undefined1 in_stack_ffffffffffffff9f;
  Col4<unsigned_char> *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  ImageT<embree::Col4<unsigned_char>_> *in_stack_ffffffffffffffb8;
  Ref<embree::Image> *in_stack_ffffffffffffffc0;
  
  resize(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
  Camera::getISPCCamera((Camera *)image.ptr,in_stack_00000080,in_stack_00000078);
  initRayStats(in_stack_ffffffffffffff10);
  for (local_68 = 0; local_68 < *(uint *)((long)in_RDI + 0x174); local_68 = local_68 + 1) {
    (**(code **)(*in_RDI + 0x58))
              (*(undefined4 *)((long)in_RDI + 0x1c4),in_RDI,in_RDI[0x25],(int)in_RDI[0x24],
               *(undefined4 *)((long)in_RDI + 0x124),local_64);
  }
  plVar1 = (long *)::operator_new(0x48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"",&local_91);
  ImageT<embree::Col4<unsigned_char>_>::ImageT
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f,in_stack_ffffffffffffff90,
             (bool)in_stack_ffffffffffffff8f);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
  }
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  storeImage(in_stack_ffffffffffffffc0,(FileName *)in_stack_ffffffffffffffb8);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x18))();
  }
  return;
}

Assistant:

void TutorialApplication::renderToFile(const FileName& fileName)
  {
    resize(width,height);
    ISPCCamera ispccamera = camera.getISPCCamera(width,height);
    initRayStats();
    
    for (unsigned int i=0; i<numFrames; i++)
      render(pixels,width,height,render_time,ispccamera);
    
    Ref<Image> image = new Image4uc(width, height, (Col4uc*)pixels);
    storeImage(image, fileName);
  }